

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::extMul<4ul,unsigned_short,unsigned_int,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Literal *val;
  long lVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  undefined1 local_228 [8];
  LaneArray<4UL_*_2> lhs;
  LaneArray<4UL_*_2> rhs;
  LaneArray<4UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanes<unsigned_short,8>((LaneArray<8> *)local_228,this,a);
  getLanes<unsigned_short,8>((LaneArray<8> *)&lhs._M_elems[7].type,(wasm *)a,val);
  rhs._M_elems[7].type.id = 0;
  lVar1 = 0;
  do {
    if ((*(long *)((long)&lhs._M_elems[4].field_0 + lVar1 + 8) != 2) ||
       (*(long *)((long)&rhs._M_elems[4].field_0 + lVar1 + 8) != 2)) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    local_40.i32 = (uint)*(ushort *)((long)&rhs._M_elems[3].type.id + lVar1) *
                   (uint)*(ushort *)((long)&lhs._M_elems[3].type.id + lVar1);
    local_30 = 2;
    this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)result._M_elems + lVar1 + -8);
    if (this_00 != &local_40) {
      Literal::~Literal((Literal *)&this_00->func);
      Literal::Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    Literal::~Literal((Literal *)&local_40.func);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  Literal::Literal(__return_storage_ptr__,(LaneArray<4> *)&rhs._M_elems[7].type);
  lVar1 = 0x48;
  do {
    Literal::~Literal((Literal *)((long)result._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    Literal::~Literal((Literal *)((long)rhs._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    Literal::~Literal((Literal *)(local_228 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}